

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestRegistry::registerTest(TestRegistry *this,TestCase *testCase)

{
  bool bVar1;
  TestCaseInfo *pTVar2;
  TestCase *this_00;
  TestCase *in_RSI;
  ulong uVar3;
  value_type *in_RDI;
  ostringstream oss;
  string name;
  char *in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  string *this_01;
  string *in_stack_fffffffffffffd10;
  TestCase *in_stack_fffffffffffffd18;
  undefined1 local_2d0 [280];
  ostringstream local_1b8 [392];
  string local_30 [48];
  
  pTVar2 = TestCase::getTestCaseInfo(in_RSI);
  this_01 = local_30;
  std::__cxx11::string::string(this_01,(string *)pTVar2);
  bVar1 = std::operator==(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    this_00 = (TestCase *)std::operator<<((ostream *)local_1b8,"Anonymous test case ");
    uVar3 = *(long *)&(in_RDI->super_TestCaseInfo).description + 1;
    *(ulong *)&(in_RDI->super_TestCaseInfo).description = uVar3;
    std::ostream::operator<<(this_00,uVar3);
    std::__cxx11::ostringstream::str();
    TestCase::withName(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    (**(code **)(*(long *)&in_RDI->super_TestCaseInfo + 0x20))(in_RDI,local_2d0);
    TestCase::~TestCase(this_00);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd10);
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
  else {
    std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
              ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)this_01,in_RDI);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

virtual void registerTest( TestCase const& testCase ) {
            std::string name = testCase.getTestCaseInfo().name;
            if( name == "" ) {
                std::ostringstream oss;
                oss << "Anonymous test case " << ++m_unnamedCount;
                return registerTest( testCase.withName( oss.str() ) );
            }
            m_functions.push_back( testCase );
        }